

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSIMDExtract
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          SIMDExtract *curr)

{
  Literal *__return_storage_ptr___00;
  Literal local_158;
  Literal local_140;
  Literal local_128;
  Literal local_110;
  Literal local_f8;
  Literal local_e0;
  Literal local_c8;
  Literal local_b0;
  Literal local_98;
  undefined1 local_80 [8];
  Flow flow;
  Literal vec;
  
  visit((Flow *)local_80,this,curr->vec);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_80 != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)&flow);
    switch(curr->op) {
    case ExtractLaneSVecI8x16:
      __return_storage_ptr___00 = &local_158;
      Literal::extractLaneSI8x16
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneUVecI8x16:
      __return_storage_ptr___00 = &local_140;
      Literal::extractLaneUI8x16
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneSVecI16x8:
      __return_storage_ptr___00 = &local_128;
      Literal::extractLaneSI16x8
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneUVecI16x8:
      __return_storage_ptr___00 = &local_110;
      Literal::extractLaneUI16x8
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneVecI32x4:
      __return_storage_ptr___00 = &local_f8;
      Literal::extractLaneI32x4
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneVecI64x2:
      __return_storage_ptr___00 = &local_e0;
      Literal::extractLaneI64x2
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneVecF16x8:
      __return_storage_ptr___00 = &local_c8;
      Literal::extractLaneF16x8
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneVecF32x4:
      __return_storage_ptr___00 = &local_b0;
      Literal::extractLaneF32x4
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    case ExtractLaneVecF64x2:
      __return_storage_ptr___00 = &local_98;
      Literal::extractLaneF64x2
                (__return_storage_ptr___00,(Literal *)&flow.breakTo.super_IString.str._M_str,
                 curr->index);
      Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
      break;
    default:
      handle_unreachable("invalid op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                         ,0x4b8);
    }
    Literal::~Literal(__return_storage_ptr___00);
    Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_80;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDExtract(SIMDExtract* curr) {
    NOTE_ENTER("SIMDExtract");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case ExtractLaneSVecI8x16:
        return vec.extractLaneSI8x16(curr->index);
      case ExtractLaneUVecI8x16:
        return vec.extractLaneUI8x16(curr->index);
      case ExtractLaneSVecI16x8:
        return vec.extractLaneSI16x8(curr->index);
      case ExtractLaneUVecI16x8:
        return vec.extractLaneUI16x8(curr->index);
      case ExtractLaneVecI32x4:
        return vec.extractLaneI32x4(curr->index);
      case ExtractLaneVecI64x2:
        return vec.extractLaneI64x2(curr->index);
      case ExtractLaneVecF16x8:
        return vec.extractLaneF16x8(curr->index);
      case ExtractLaneVecF32x4:
        return vec.extractLaneF32x4(curr->index);
      case ExtractLaneVecF64x2:
        return vec.extractLaneF64x2(curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }